

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_signal_del_(event_base *base,int sig,event *ev)

{
  eventop *peVar1;
  long *plVar2;
  event **ppeVar3;
  int iVar4;
  event *peVar5;
  
  iVar4 = -1;
  if ((-1 < sig) && (sig < (base->sigmap).nentries)) {
    peVar1 = base->evsigsel;
    plVar2 = (long *)(base->sigmap).entries[(uint)sig];
    peVar5 = (ev->ev_).ev_io.ev_io_next.le_next;
    ppeVar3 = (ev->ev_).ev_io.ev_io_next.le_prev;
    if (peVar5 == (event *)0x0) {
      peVar5 = (event *)0x0;
    }
    else {
      (peVar5->ev_).ev_io.ev_io_next.le_prev = ppeVar3;
      peVar5 = (ev->ev_).ev_io.ev_io_next.le_next;
    }
    *ppeVar3 = peVar5;
    if ((*plVar2 == 0) && (iVar4 = (*peVar1->del)(base,ev->ev_fd,0,8,(void *)0x0), iVar4 == -1)) {
      return -1;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
evmap_signal_del_(struct event_base *base, int sig, struct event *ev)
{
	const struct eventop *evsel = base->evsigsel;
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx;

	if (sig < 0 || sig >= map->nentries)
		return (-1);

	GET_SIGNAL_SLOT(ctx, map, sig, evmap_signal);

	LIST_REMOVE(ev, ev_signal_next);

	if (LIST_FIRST(&ctx->events) == NULL) {
		if (evsel->del(base, ev->ev_fd, 0, EV_SIGNAL, NULL) == -1)
			return (-1);
	}

	return (1);
}